

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::swap(Texture *this,Texture *right)

{
  Uint64 UVar1;
  Texture *right_local;
  Texture *this_local;
  
  std::swap<sf::Vector2<unsigned_int>>(&this->m_size,&right->m_size);
  std::swap<sf::Vector2<unsigned_int>>(&this->m_actualSize,&right->m_actualSize);
  std::swap<unsigned_int>(&this->m_texture,&right->m_texture);
  std::swap<bool>(&this->m_isSmooth,&right->m_isSmooth);
  std::swap<bool>(&this->m_sRgb,&right->m_sRgb);
  std::swap<bool>(&this->m_isRepeated,&right->m_isRepeated);
  std::swap<bool>(&this->m_pixelsFlipped,&right->m_pixelsFlipped);
  std::swap<bool>(&this->m_fboAttachment,&right->m_fboAttachment);
  std::swap<bool>(&this->m_hasMipmap,&right->m_hasMipmap);
  UVar1 = anon_unknown.dwarf_d70e4::getUniqueId();
  this->m_cacheId = UVar1;
  UVar1 = anon_unknown.dwarf_d70e4::getUniqueId();
  right->m_cacheId = UVar1;
  return;
}

Assistant:

void Texture::swap(Texture& right)
{
    std::swap(m_size,          right.m_size);
    std::swap(m_actualSize,    right.m_actualSize);
    std::swap(m_texture,       right.m_texture);
    std::swap(m_isSmooth,      right.m_isSmooth);
    std::swap(m_sRgb,          right.m_sRgb);
    std::swap(m_isRepeated,    right.m_isRepeated);
    std::swap(m_pixelsFlipped, right.m_pixelsFlipped);
    std::swap(m_fboAttachment, right.m_fboAttachment);
    std::swap(m_hasMipmap,     right.m_hasMipmap);

    m_cacheId = getUniqueId();
    right.m_cacheId = getUniqueId();
}